

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dec_api.c
# Opt level: O0

MPP_RET dummy_dec_init(void *dec,ParserCfg *cfg)

{
  MppPacket local_48;
  MppPacket task_pkt;
  size_t stream_size;
  void *stream;
  RK_S32 i;
  DummyDec *p;
  ParserCfg *cfg_local;
  void *dec_local;
  
  task_pkt = (MppPacket)0x80000;
  p = (DummyDec *)cfg;
  cfg_local = (ParserCfg *)dec;
  if (dec == (void *)0x0) {
    _mpp_log_l(2,"dummy_dec_api","found NULL intput dec %p cfg %p\n","dummy_dec_init",0,cfg);
    dec_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    stream_size = (size_t)mpp_osal_malloc("dummy_dec_init",0x80000);
    if ((void *)stream_size == (void *)0x0) {
      _mpp_log_l(2,"dummy_dec_api","failed to malloc stream buffer size %d\n","dummy_dec_init",
                 task_pkt);
      dec_local._4_4_ = MPP_ERR_MALLOC;
    }
    else {
      mpp_packet_init(&local_48,(void *)stream_size,(size_t)task_pkt);
      if (local_48 == (MppPacket)0x0) {
        _mpp_log_l(2,"dummy_dec_api","failed to create mpp_packet for task\n","dummy_dec_init");
        dec_local._4_4_ = MPP_ERR_UNKNOW;
      }
      else {
        *(MppBufSlots *)cfg_local = p->packet_slots;
        cfg_local->frame_slots = *(MppBufSlots *)&p->task_count;
        *(undefined4 *)&cfg_local->packet_slots = 2;
        cfg_local->cfg = (MppDecCfgSet *)stream_size;
        cfg_local->hw_info = (MppDecHwCap *)task_pkt;
        *(MppPacket *)(cfg_local + 1) = local_48;
        for (stream._4_4_ = 0; stream._4_4_ < 2; stream._4_4_ = stream._4_4_ + 1) {
          *(undefined4 *)((long)&cfg_local[1].hw_info + (long)stream._4_4_ * 4) = 0xffffffff;
        }
        dec_local._4_4_ = MPP_OK;
      }
    }
  }
  return dec_local._4_4_;
}

Assistant:

MPP_RET dummy_dec_init(void *dec, ParserCfg *cfg)
{
    DummyDec *p;
    RK_S32 i;
    void *stream;
    size_t stream_size = SZ_512K;
    MppPacket task_pkt;

    if (NULL == dec) {
        mpp_err_f("found NULL intput dec %p cfg %p\n", dec, cfg);
        return MPP_ERR_NULL_PTR;
    }

    stream = mpp_malloc_size(void, stream_size);
    if (NULL == stream) {
        mpp_err_f("failed to malloc stream buffer size %d\n", stream_size);
        return MPP_ERR_MALLOC;
    }

    mpp_packet_init(&task_pkt, stream, stream_size);
    if (NULL == task_pkt) {
        mpp_err_f("failed to create mpp_packet for task\n");
        return MPP_ERR_UNKNOW;
    }

    p = (DummyDec *)dec;
    p->frame_slots  = cfg->frame_slots;
    p->packet_slots = cfg->packet_slots;
    p->task_count   = 2;
    p->stream       = stream;
    p->stream_size  = stream_size;
    p->task_pkt     = task_pkt;
    for (i = 0; i < DUMMY_DEC_REF_COUNT; i++) {
        p->slot_index[i] = -1;
    }
    return MPP_OK;
}